

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

Property *
Rml::ElementStyle::GetProperty
          (PropertyId id,Element *element,PropertyDictionary *inline_properties,
          ElementDefinition *definition)

{
  bool bVar1;
  PropertyDefinition *this;
  ElementStyle *this_00;
  Property *pPVar2;
  Property *parent_property;
  Element *parent;
  PropertyDefinition *property;
  Property *local_property;
  ElementDefinition *definition_local;
  PropertyDictionary *inline_properties_local;
  Element *element_local;
  Property *pPStack_10;
  PropertyId id_local;
  
  pPStack_10 = GetLocalProperty(id,inline_properties,definition);
  if (pPStack_10 == (Property *)0x0) {
    this = StyleSheetSpecification::GetProperty(id);
    if (this == (PropertyDefinition *)0x0) {
      pPStack_10 = (Property *)0x0;
    }
    else {
      bVar1 = PropertyDefinition::IsInherited(this);
      if (bVar1) {
        for (parent_property = (Property *)Element::GetParentNode(element);
            parent_property != (Property *)0x0;
            parent_property = (Property *)Element::GetParentNode((Element *)parent_property)) {
          this_00 = Element::GetStyle((Element *)parent_property);
          pPVar2 = GetLocalProperty(this_00,id);
          if (pPVar2 != (Property *)0x0) {
            return pPVar2;
          }
        }
      }
      pPStack_10 = PropertyDefinition::GetDefaultValue(this);
    }
  }
  return pPStack_10;
}

Assistant:

const Property* ElementStyle::GetProperty(PropertyId id, const Element* element, const PropertyDictionary& inline_properties,
	const ElementDefinition* definition)
{
	const Property* local_property = GetLocalProperty(id, inline_properties, definition);
	if (local_property)
		return local_property;

	// Fetch the property specification.
	const PropertyDefinition* property = StyleSheetSpecification::GetProperty(id);
	if (!property)
		return nullptr;

	// If we can inherit this property, return our parent's property.
	if (property->IsInherited())
	{
		Element* parent = element->GetParentNode();
		while (parent)
		{
			const Property* parent_property = parent->GetStyle()->GetLocalProperty(id);
			if (parent_property)
				return parent_property;

			parent = parent->GetParentNode();
		}
	}

	// No property available! Return the default value.
	return property->GetDefaultValue();
}